

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_peer_connection.cpp
# Opt level: O2

bool __thiscall
libtorrent::aux::web_peer_connection::received_invalid_data
          (web_peer_connection *this,piece_index_t index,bool single_peer)

{
  element_type *this_00;
  bool bVar1;
  int iVar2;
  undefined7 in_register_00000011;
  _Head_base<0UL,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_false>
  index_00;
  tuple<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  range;
  vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_> files;
  shared_ptr<libtorrent::aux::torrent> t;
  
  if ((int)CONCAT71(in_register_00000011,single_peer) != 0) {
    ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
              ((__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&files,
               &(this->super_web_connection_base).super_peer_connection.
                super_peer_connection_hot_members.m_torrent.
                super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
    ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>,
               (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&files);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
               &files.
                super__Vector_base<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>.
                _M_impl.super__Vector_impl_data._M_finish);
    this_00 = ((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_torrent_hot_members).m_torrent_file.
              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar2 = file_storage::num_files(&this_00->m_files);
    if (iVar2 == 1) {
      bVar1 = peer_connection::received_invalid_data((peer_connection *)this,index,true);
    }
    else {
      iVar2 = file_storage::piece_size(&this_00->m_files,index);
      file_storage::map_block(&files,&this_00->m_files,index,0,(long)iVar2);
      if ((long)files.
                super__Vector_base<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)files.
                super__Vector_base<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x18) {
        file_piece_range_inclusive
                  ((aux *)&range,&this_00->m_files,
                   (file_index_t)
                   ((files.
                     super__Vector_base<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>
                     ._M_impl.super__Vector_impl_data._M_start)->file_index).m_val);
        for (index_00 = range.
                        super__Tuple_impl<0UL,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                        .
                        super__Head_base<0UL,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_false>
            ; (_Head_base<1UL,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_false>
               )index_00._M_head_impl.m_val !=
              range.
              super__Tuple_impl<0UL,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
              .
              super__Tuple_impl<1UL,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
              .
              super__Head_base<1UL,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_false>
              ._M_head_impl.m_val;
            index_00._M_head_impl.m_val =
                 (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)
                 ((int)index_00._M_head_impl.m_val + 1)) {
          peer_connection::incoming_dont_have((peer_connection *)this,index_00._M_head_impl.m_val);
        }
      }
      else {
        peer_connection::incoming_dont_have((peer_connection *)this,index);
      }
      peer_connection::received_invalid_data((peer_connection *)this,index,true);
      bVar1 = (this->super_web_connection_base).super_peer_connection.m_num_pieces == 0;
      ::std::_Vector_base<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>::
      ~_Vector_base(&files.
                     super__Vector_base<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>
                   );
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return bVar1;
  }
  bVar1 = peer_connection::received_invalid_data((peer_connection *)this,index,false);
  return bVar1;
}

Assistant:

bool web_peer_connection::received_invalid_data(piece_index_t const index, bool single_peer)
{
	if (!single_peer) return peer_connection::received_invalid_data(index, single_peer);

	// when a web seed fails a hash check, do the following:
	// 1. if the whole piece only overlaps a single file, mark that file as not
	//    have for this peer
	// 2. if the piece overlaps more than one file, mark the piece as not have
	//    for this peer
	// 3. if it's a single file torrent, just ban it right away
	// this handles the case where web seeds may have some files updated but not other

	auto t = associated_torrent().lock();
	file_storage const& fs = t->torrent_file().files();

	// single file torrent
	if (fs.num_files() == 1) return peer_connection::received_invalid_data(index, single_peer);

	std::vector<file_slice> files = fs.map_block(index, 0, fs.piece_size(index));

	if (files.size() == 1)
	{
		// assume the web seed has a different copy of this specific file
		// than what we expect, and pretend not to have it.
		auto const range = file_piece_range_inclusive(fs, files[0].file_index);
		for (piece_index_t i = std::get<0>(range); i != std::get<1>(range); ++i)
			incoming_dont_have(i);
	}
	else
	{
		incoming_dont_have(index);
	}

	peer_connection::received_invalid_data(index, single_peer);

	// if we don't think we have any of the files, allow banning the web seed
	if (num_have_pieces() == 0) return true;

	// don't disconnect, we won't request anything from this file again
	return false;
}